

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnSimdShuffleOpExpr
          (ExprVisitorDelegate *this,SimdShuffleOpExpr *expr)

{
  WatWriter *this_00;
  char *s;
  SimdShuffleOpExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  this_00 = this->writer_;
  s = Opcode::GetName(&expr->opcode);
  WritePutsSpace(this_00,s);
  Writef(this->writer_," 0x%08x 0x%08x 0x%08x 0x%08x",(ulong)(expr->val).v[0],
         (ulong)(expr->val).v[1],(ulong)(expr->val).v[2],(ulong)(expr->val).v[3]);
  WritePutsNewline(this->writer_,"");
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnSimdShuffleOpExpr(
    SimdShuffleOpExpr* expr) {
  writer_->WritePutsSpace(expr->opcode.GetName());
  writer_->Writef(" 0x%08x 0x%08x 0x%08x 0x%08x", (expr->val.v[0]), (expr->val.v[1]),
                  (expr->val.v[2]), (expr->val.v[3]));
  writer_->WritePutsNewline("");
  return Result::Ok;
}